

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O2

trie_node * trie_lookup(trie_node *root,lrtr_ip_addr *prefix,uint8_t mask_len,uint *lvl)

{
  lrtr_ip_addr a;
  lrtr_ip_addr b;
  _Bool _Var1;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff94;
  lrtr_ip_version in_stack_ffffffffffffff98;
  undefined8 uStack_60;
  undefined4 local_58;
  lrtr_ip_addr local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  while (root != (trie_node *)0x0) {
    if (root->len <= mask_len) {
      lrtr_ip_addr_get_bits(&local_50,&root->prefix,'\0',root->len);
      lrtr_ip_addr_get_bits((lrtr_ip_addr *)&stack0xffffffffffffff98,prefix,'\0',root->len);
      a.u.addr6.addr[1] = local_50.u.addr6.addr[3];
      a._0_8_ = local_50.u._4_8_;
      a.u.addr6.addr[2] = in_stack_ffffffffffffff7c;
      a.u.addr6.addr[3] = in_stack_ffffffffffffff98;
      b.u.addr6.addr[1] = local_58;
      b._0_8_ = uStack_60;
      b.u.addr6.addr[2] = in_stack_ffffffffffffff94;
      b.u.addr6.addr[3] = in_stack_ffffffffffffff98;
      _Var1 = lrtr_ip_addr_equal(a,b);
      if (_Var1) break;
    }
    _Var1 = is_left_child(prefix,*lvl);
    root = (&root->rchild)[_Var1];
    *lvl = *lvl + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return root;
  }
  __stack_chk_fail();
}

Assistant:

struct trie_node *trie_lookup(const struct trie_node *root, const struct lrtr_ip_addr *prefix, const uint8_t mask_len,
			      unsigned int *lvl)
{
	while (root) {
		if (root->len <= mask_len && lrtr_ip_addr_equal(lrtr_ip_addr_get_bits(&root->prefix, 0, root->len),
								lrtr_ip_addr_get_bits(prefix, 0, root->len)))
			return (struct trie_node *)root;

		if (is_left_child(prefix, *lvl))
			root = root->lchild;
		else
			root = root->rchild;

		(*lvl)++;
	}
	return NULL;
}